

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.c
# Opt level: O3

LY_ERR structure_compile(lysc_ctx *cctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  uint32_t uVar1;
  lysc_ext_substmt *plVar2;
  int iVar3;
  LY_ERR LVar4;
  uint32_t *puVar5;
  void *pvVar6;
  long *plVar7;
  LY_ERR err;
  char *format;
  char *pcVar8;
  long lVar9;
  uint16_t *puVar10;
  
  puVar5 = lyplg_ext_compile_get_options(cctx);
  uVar1 = *puVar5;
  puVar10 = *(uint16_t **)((long)ext->parent + 8);
  if (puVar10 != (uint16_t *)0x0) {
    pcVar8 = ext->argument;
    do {
      iVar3 = strcmp(*(char **)(puVar10 + 0x14),pcVar8);
      if (iVar3 == 0) {
        pcVar8 = extp->name;
        lys_nodetype2str(*puVar10);
        format = "Extension %s collides with a %s with the same identifier.";
        LVar4 = LY_EVALID;
        err = LY_EVALID;
        goto LAB_001a029b;
      }
      puVar10 = *(uint16_t **)(puVar10 + 0xc);
    } while (puVar10 != (uint16_t *)0x0);
  }
  pvVar6 = calloc(1,0x28);
  if (pvVar6 == (void *)0x0) {
LAB_001a027b:
    format = "Memory allocation failed (%s()).";
    pcVar8 = "structure_compile";
    LVar4 = LY_EMEM;
    err = LY_EMEM;
LAB_001a029b:
    lyplg_ext_compile_log(cctx,ext,LY_LLERR,err,format,pcVar8);
  }
  else {
    ext->compiled = pvVar6;
    plVar2 = ext->substmts;
    if (plVar2 == (lysc_ext_substmt *)0x0) {
      plVar7 = (long *)calloc(1,0xe8);
      if (plVar7 == (long *)0x0) goto LAB_001a027b;
      lVar9 = 0;
    }
    else {
      plVar7 = (long *)realloc(&plVar2[-1].storage_p,(long)plVar2[-1].storage_p * 0x10 + 0xe8);
      if (plVar7 == (long *)0x0) goto LAB_001a027b;
      lVar9 = *plVar7;
    }
    ext->substmts = (lysc_ext_substmt *)(plVar7 + 1);
    memset(plVar7 + lVar9 * 2 + 1,0,0xe0);
    *(undefined4 *)(plVar7 + 1) = 0x1d0000;
    plVar7[2] = (long)pvVar6;
    *(undefined4 *)(plVar7 + 3) = 0x2c0000;
    plVar7[4] = (long)pvVar6 + 8;
    *(undefined4 *)(plVar7 + 5) = 0x80000;
    plVar7[6] = (long)pvVar6 + 0x10;
    *(undefined4 *)(plVar7 + 7) = 0x270000;
    plVar7[8] = (long)pvVar6 + 0x18;
    *(undefined4 *)(plVar7 + 9) = 0x2f0000;
    plVar7[10] = 0;
    *(undefined4 *)(plVar7 + 0xb) = 0x800;
    plVar7[0xc] = 0;
    *(undefined4 *)(plVar7 + 0xd) = 0x400;
    lVar9 = (long)pvVar6 + 0x20;
    plVar7[0xe] = lVar9;
    *(undefined4 *)(plVar7 + 0xf) = 0x1000;
    plVar7[0x10] = lVar9;
    *(undefined4 *)(plVar7 + 0x11) = 0x2000;
    plVar7[0x12] = lVar9;
    *(undefined4 *)(plVar7 + 0x13) = 0x4000;
    plVar7[0x14] = lVar9;
    *(undefined4 *)(plVar7 + 0x15) = 0x200;
    plVar7[0x16] = lVar9;
    *(undefined4 *)(plVar7 + 0x17) = 0x20;
    plVar7[0x18] = lVar9;
    *(undefined4 *)(plVar7 + 0x19) = 0x40;
    plVar7[0x1a] = lVar9;
    *plVar7 = *plVar7 + 0xe;
    *(undefined4 *)(plVar7 + 0x1b) = 0x8000;
    plVar7[0x1c] = lVar9;
    puVar5 = lyplg_ext_compile_get_options(cctx);
    *(byte *)puVar5 = (byte)*puVar5 | 0xc;
    LVar4 = lyplg_ext_compile_extension_instance(cctx,extp,ext);
    puVar5 = lyplg_ext_compile_get_options(cctx);
    *puVar5 = uVar1;
  }
  return LVar4;
}

Assistant:

static LY_ERR
structure_compile(struct lysc_ctx *cctx, const struct lysp_ext_instance *extp, struct lysc_ext_instance *ext)
{
    LY_ERR rc;
    struct lysc_module *mod_c;
    const struct lysc_node *child;
    struct lysc_ext_instance_structure *struct_cdata;
    uint32_t prev_options = *lyplg_ext_compile_get_options(cctx);

    mod_c = ext->parent;

    /* check identifier namespace with the compiled nodes */
    LY_LIST_FOR(mod_c->data, child) {
        if (!strcmp(child->name, ext->argument)) {
            /* identifier collision */
            lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,  "Extension %s collides with a %s with the same identifier.",
                    extp->name, lys_nodetype2str(child->nodetype));
            return LY_EVALID;
        }
    }

    /* allocate the storage */
    struct_cdata = calloc(1, sizeof *struct_cdata);
    if (!struct_cdata) {
        goto emem;
    }
    ext->compiled = struct_cdata;

    /* compile substatements */
    LY_ARRAY_CREATE_GOTO(cctx->ctx, ext->substmts, 14, rc, emem);
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[0].stmt = LY_STMT_MUST;
    ext->substmts[0].storage_p = (void **)&struct_cdata->musts;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[1].stmt = LY_STMT_STATUS;
    ext->substmts[1].storage_p = (void **)&struct_cdata->flags;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[2].stmt = LY_STMT_DESCRIPTION;
    ext->substmts[2].storage_p = (void **)&struct_cdata->dsc;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[3].stmt = LY_STMT_REFERENCE;
    ext->substmts[3].storage_p = (void **)&struct_cdata->ref;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[4].stmt = LY_STMT_TYPEDEF;
    ext->substmts[4].storage_p = 0;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[5].stmt = LY_STMT_GROUPING;
    ext->substmts[5].storage_p = 0;

    /* data-def-stmt */
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[6].stmt = LY_STMT_CONTAINER;
    ext->substmts[6].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[7].stmt = LY_STMT_LEAF;
    ext->substmts[7].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[8].stmt = LY_STMT_LEAF_LIST;
    ext->substmts[8].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[9].stmt = LY_STMT_LIST;
    ext->substmts[9].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[10].stmt = LY_STMT_CHOICE;
    ext->substmts[10].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[11].stmt = LY_STMT_ANYDATA;
    ext->substmts[11].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[12].stmt = LY_STMT_ANYXML;
    ext->substmts[12].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[13].stmt = LY_STMT_USES;
    ext->substmts[13].storage_p = (void **)&struct_cdata->child;

    *lyplg_ext_compile_get_options(cctx) |= LYS_COMPILE_NO_CONFIG | LYS_COMPILE_NO_DISABLED;
    rc = lyplg_ext_compile_extension_instance(cctx, extp, ext);
    *lyplg_ext_compile_get_options(cctx) = prev_options;
    if (rc) {
        return rc;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return LY_EMEM;
}